

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

UBool icu_63::DateFormatSymbols::isNumericPatternChar(UChar c,int32_t count)

{
  UBool UVar1;
  UDateFormatField f;
  int32_t count_local;
  UChar c_local;
  
  f = getPatternCharIndex(c);
  UVar1 = isNumericField(f,count);
  return UVar1;
}

Assistant:

UBool U_EXPORT2
DateFormatSymbols::isNumericPatternChar(UChar c, int32_t count) {
    return isNumericField(getPatternCharIndex(c), count);
}